

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void Imf_3_2::anon_unknown_0::readLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets,bool *complete)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer puVar3;
  IoExc *this;
  ulong uVar4;
  pointer puVar5;
  ulong uVar6;
  ulong local_40;
  undefined8 local_38;
  
  uVar1 = 0;
  while( true ) {
    puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3;
    if (uVar4 <= uVar1) break;
    Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,puVar3 + uVar1);
    uVar1 = uVar1 + 1;
  }
  *complete = true;
  uVar6 = 0;
  do {
    if (uVar4 <= uVar6) {
      return;
    }
    puVar5 = puVar3 + uVar6;
    uVar6 = (ulong)((int)uVar6 + 1);
  } while (*puVar5 != 0);
  *complete = false;
  iVar2 = (*is->_vptr_IStream[5])(is);
  local_38 = CONCAT44(extraout_var,iVar2);
  puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = 0;
  while( true ) {
    uVar4 = (ulong)uVar1;
    if ((ulong)((long)(lineOffsets->
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar3 >> 3) <= uVar4) {
      (*is->_vptr_IStream[7])(is);
      (*is->_vptr_IStream[6])(is,local_38);
      return;
    }
    iVar2 = (*is->_vptr_IStream[5])(is);
    (*is->_vptr_IStream[3])(is,&local_40,4);
    (*is->_vptr_IStream[3])(is,&local_40,8);
    uVar6 = local_40;
    (*is->_vptr_IStream[3])(is,&local_40,8);
    if ((0x7fffffffffffffff - uVar6 < local_40) ||
       (uVar6 = local_40 + uVar6, (uVar6 & 0xfffffffffffffff8) == 0x7ffffffffffffff8)) break;
    Xdr::skip<Imf_3_2::StreamIO,Imf_3_2::IStream>(is,(int)uVar6 + 8);
    if (lineOrder == INCREASING_Y) {
      puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = puVar3 + uVar4;
    }
    else {
      puVar3 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar5 = (lineOffsets->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish + ~uVar4;
    }
    *puVar5 = CONCAT44(extraout_var_00,iVar2);
    uVar1 = uVar1 + 1;
  }
  this = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::IoExc::IoExc(this,"Invalid chunk size");
  __cxa_throw(this,&Iex_3_2::IoExc::typeinfo,Iex_3_2::IoExc::~IoExc);
}

Assistant:

void
readLineOffsets (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
    LineOrder                                lineOrder,
    vector<uint64_t>&                        lineOffsets,
    bool&                                    complete)
{
    for (unsigned int i = 0; i < lineOffsets.size (); i++)
    {
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, lineOffsets[i]);
    }

    complete = true;

    for (unsigned int i = 0; i < lineOffsets.size (); i++)
    {
        if (lineOffsets[i] <= 0)
        {
            //
            // Invalid data in the line offset table mean that
            // the file is probably incomplete (the table is
            // the last thing written to the file).  Either
            // some process is still busy writing the file,
            // or writing the file was aborted.
            //
            // We should still be able to read the existing
            // parts of the file.  In order to do this, we
            // have to make a sequential scan over the scan
            // line data to reconstruct the line offset table.
            //

            complete = false;
            reconstructLineOffsets (is, lineOrder, lineOffsets);
            break;
        }
    }
}